

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::ApproxQuantileFun::GetFunctions(void)

{
  AggregateFunction *in_RDI;
  AggregateFunctionSet *approx_quantile;
  AggregateFunction *in_stack_ffffffffffffe138;
  AggregateFunction *this;
  LogicalType local_1eb0 [8];
  LogicalType *in_stack_ffffffffffffe158;
  LogicalType *in_stack_ffffffffffffe188;
  LogicalType local_1d68 [328];
  LogicalType local_1c20 [328];
  LogicalType local_1ad8 [328];
  LogicalType local_1990 [328];
  LogicalType local_1848 [328];
  LogicalType local_1700 [328];
  LogicalType local_15b8 [328];
  LogicalType local_1470 [328];
  LogicalType local_1328 [328];
  LogicalType local_11e0 [328];
  LogicalType local_1098 [632];
  LogicalType local_e20 [328];
  LogicalType local_cd8 [328];
  LogicalType local_b90 [328];
  LogicalType local_a48 [328];
  LogicalType local_900 [328];
  LogicalType local_7b8 [328];
  LogicalType local_670 [328];
  LogicalType local_528 [328];
  LogicalType local_3e0 [328];
  LogicalType local_298 [655];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  duckdb::AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)in_RDI);
  GetApproxQuantileDecimal();
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::LogicalType(local_298,SMALLINT);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_298);
  duckdb::LogicalType::LogicalType(local_3e0,INTEGER);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_3e0);
  duckdb::LogicalType::LogicalType(local_528,BIGINT);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_528);
  duckdb::LogicalType::LogicalType(local_670,HUGEINT);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_670);
  duckdb::LogicalType::LogicalType(local_7b8,DOUBLE);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_7b8);
  duckdb::LogicalType::LogicalType(local_900,DATE);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_900);
  duckdb::LogicalType::LogicalType(local_a48,TIME);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_a48);
  duckdb::LogicalType::LogicalType(local_b90,TIME_TZ);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_b90);
  duckdb::LogicalType::LogicalType(local_cd8,TIMESTAMP);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_cd8);
  duckdb::LogicalType::LogicalType(local_e20,TIMESTAMP_TZ);
  GetApproximateQuantileAggregate(in_stack_ffffffffffffe158);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_e20);
  GetApproxQuantileDecimalList();
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::LogicalType(local_1098,TINYINT);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1098);
  duckdb::LogicalType::LogicalType(local_11e0,SMALLINT);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_11e0);
  duckdb::LogicalType::LogicalType(local_1328,INTEGER);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1328);
  duckdb::LogicalType::LogicalType(local_1470,BIGINT);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1470);
  duckdb::LogicalType::LogicalType(local_15b8,HUGEINT);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_15b8);
  duckdb::LogicalType::LogicalType(local_1700,FLOAT);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1700);
  duckdb::LogicalType::LogicalType(local_1848,DOUBLE);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1848);
  duckdb::LogicalType::LogicalType(local_1990,DATE);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1990);
  duckdb::LogicalType::LogicalType(local_1ad8,TIME);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1ad8);
  duckdb::LogicalType::LogicalType(local_1c20,TIME_TZ);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1c20);
  duckdb::LogicalType::LogicalType(local_1d68,TIMESTAMP);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1d68);
  duckdb::LogicalType::LogicalType(local_1eb0,TIMESTAMP_TZ);
  GetApproxQuantileListAggregate(in_stack_ffffffffffffe188);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_stack_ffffffffffffe138);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1eb0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ApproxQuantileFun::GetFunctions() {
	AggregateFunctionSet approx_quantile;
	approx_quantile.AddFunction(GetApproxQuantileDecimal());

	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::SMALLINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::INTEGER));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::BIGINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::HUGEINT));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::DOUBLE));

	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::DATE));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIME));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIME_TZ));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIMESTAMP));
	approx_quantile.AddFunction(GetApproximateQuantileAggregate(LogicalType::TIMESTAMP_TZ));

	// List variants
	approx_quantile.AddFunction(GetApproxQuantileDecimalList());

	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::TINYINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::SMALLINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::INTEGER));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::BIGINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::HUGEINT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::FLOAT));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalTypeId::DOUBLE));

	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::DATE));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIME));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIME_TZ));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIMESTAMP));
	approx_quantile.AddFunction(GetApproxQuantileListAggregate(LogicalType::TIMESTAMP_TZ));

	return approx_quantile;
}